

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cc
# Opt level: O3

double ipx::PrimalResidual(Model *model,Vector *x)

{
  int iVar1;
  int iVar2;
  pointer piVar3;
  uint uVar4;
  ulong uVar5;
  long lVar6;
  double dVar7;
  double dVar8;
  
  uVar4 = (uint)(model->b_)._M_size;
  if (0 < (int)uVar4) {
    piVar3 = (model->AIt_).colptr_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar5 = 0;
    dVar7 = 0.0;
    do {
      iVar1 = piVar3[uVar5];
      lVar6 = (long)iVar1;
      iVar2 = piVar3[uVar5 + 1];
      dVar8 = 0.0;
      if (iVar1 < iVar2) {
        do {
          dVar8 = dVar8 + x->_M_data
                          [(model->AIt_).rowidx_.super__Vector_base<int,_std::allocator<int>_>.
                           _M_impl.super__Vector_impl_data._M_start[lVar6]] *
                          (model->AIt_).values_.super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_start[lVar6];
          lVar6 = lVar6 + 1;
        } while (iVar2 != lVar6);
      }
      dVar8 = ABS((model->b_)._M_data[uVar5] - dVar8);
      if (dVar8 <= dVar7) {
        dVar8 = dVar7;
      }
      uVar5 = uVar5 + 1;
      dVar7 = dVar8;
    } while (uVar5 != (uVar4 & 0x7fffffff));
    return dVar8;
  }
  return 0.0;
}

Assistant:

double PrimalResidual(const Model& model, const Vector& x) {
    const SparseMatrix& AIt = model.AIt();
    const Vector& b = model.b();
    assert((Int)x.size() == AIt.rows());

    double res = 0.0;
    for (Int i = 0; i < (Int)b.size(); i++) {
        double r = b[i] - DotColumn(AIt, i, x);
        res = std::max(res, std::abs(r));
    }
    return res;
}